

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

RPCHelpMan * wallet::getunconfirmedbalance(void)

{
  string m_key_name;
  RPCResult result;
  string description;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  undefined1 auVar1 [24];
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  code *pcVar2;
  undefined8 in_stack_fffffffffffffe30;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  undefined1 in_stack_fffffffffffffe50 [16];
  pointer in_stack_fffffffffffffe60;
  pointer pRVar6;
  pointer pRVar7;
  pointer pRVar8;
  undefined8 in_stack_fffffffffffffe80;
  long *plVar9;
  undefined8 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe90;
  undefined1 uVar10;
  undefined7 in_stack_fffffffffffffe91;
  long *local_160;
  long local_150 [2];
  long *local_140 [2];
  long local_130 [2];
  long *local_120 [2];
  long local_110 [2];
  RPCResult local_100;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getunconfirmedbalance","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"DEPRECATED\nIdentical to getbalances().mine.untrusted_pending\n",""
            );
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"The balance","");
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffe10;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe08;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffe18;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffe20;
  auVar1._16_8_ = 0;
  auVar1._0_16_ = in_stack_fffffffffffffe50;
  ::RPCResult::RPCResult
            (&local_100,NUM,m_key_name,
             (string)ZEXT1632(CONCAT88(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28)),
             (vector<RPCResult,_std::allocator<RPCResult>_>)(auVar1 << 0x40),SUB81(local_120,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe10;
  result._0_8_ = in_stack_fffffffffffffe08;
  result.m_key_name._M_string_length = in_stack_fffffffffffffe18;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffe20;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffe28;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffe30;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar3;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar4;
  result._64_8_ = pRVar5;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe50._0_8_;
  result.m_description._M_string_length = in_stack_fffffffffffffe50._8_8_;
  result.m_description.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffe60;
  result.m_description.field_2._8_8_ = pRVar6;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar7;
  result.m_cond._M_string_length = (size_type)pRVar8;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffffe80;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffe88;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffe50,result);
  plVar9 = (long *)&stack0xfffffffffffffe90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffe80,"");
  local_160 = local_150;
  if (plVar9 != (long *)&stack0xfffffffffffffe90) {
    local_160 = plVar9;
  }
  local_150[0] = CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90);
  uVar10 = 0;
  pcVar2 = std::
           _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/coins.cpp:222:9)>
           ::_M_manager;
  description._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/coins.cpp:222:9)>
       ::_M_invoke;
  description._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/coins.cpp:222:9)>
                ::_M_manager;
  description.field_2._M_allocated_capacity = (size_type)pRVar3;
  description.field_2._8_8_ = pRVar4;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_fffffffffffffe50._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_fffffffffffffe50._8_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pRVar6;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = in_stack_fffffffffffffe60;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pRVar7;
  examples.m_examples.field_2._9_7_ = in_stack_fffffffffffffe91;
  examples.m_examples._0_25_ = ZEXT1625(CONCAT88(&stack0xfffffffffffffe90,pRVar8));
  plVar9 = (long *)&stack0xfffffffffffffe90;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffe10,&stack0xfffffffffffffe18)),
             description,args,results,examples,(RPCMethodImpl *)&local_58);
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(&stack0xfffffffffffffe18,&stack0xfffffffffffffe18,3);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  if (plVar9 != (long *)&stack0xfffffffffffffe90) {
    operator_delete(plVar9,CONCAT71(in_stack_fffffffffffffe91,uVar10) + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffe50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_cond._M_dataplus._M_p != &local_100.m_cond.field_2) {
    operator_delete(local_100.m_cond._M_dataplus._M_p,
                    local_100.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_description._M_dataplus._M_p != &local_100.m_description.field_2) {
    operator_delete(local_100.m_description._M_dataplus._M_p,
                    local_100.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_100.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.m_key_name._M_dataplus._M_p != &local_100.m_key_name.field_2) {
    operator_delete(local_100.m_key_name._M_dataplus._M_p,
                    local_100.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffe38);
  if (local_140[0] != local_130) {
    operator_delete(local_140[0],local_130[0] + 1);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffe68);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

RPCHelpMan getunconfirmedbalance()
{
    return RPCHelpMan{"getunconfirmedbalance",
                "DEPRECATED\nIdentical to getbalances().mine.untrusted_pending\n",
                {},
                RPCResult{RPCResult::Type::NUM, "", "The balance"},
                RPCExamples{""},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    return ValueFromAmount(GetBalance(*pwallet).m_mine_untrusted_pending);
},
    };
}